

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateCallMethodCases
          (ServiceGenerator *this,Printer *printer)

{
  ushort *puVar1;
  MethodDescriptor *this_00;
  Descriptor *pDVar2;
  AlphaNum *a;
  long lVar3;
  allocator<char> local_450;
  allocator<char> local_44f;
  allocator<char> local_44e;
  allocator<char> local_44d;
  int local_44c;
  Options *local_448;
  Sub *local_440;
  Printer *local_438;
  basic_string_view<char,_std::char_traits<char>_> local_430;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  AlphaNum local_340;
  Sub local_310 [4];
  
  local_440 = local_310 + 2;
  local_448 = (Options *)this;
  local_438 = printer;
  for (local_44c = 0; local_44c < ((ServiceDescriptor *)local_448->access_info_map)->method_count_;
      local_44c = local_44c + 1) {
    this_00 = ServiceDescriptor::method((ServiceDescriptor *)local_448->access_info_map,local_44c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"name",&local_44d);
    puVar1 = (ushort *)(this_00->all_names_).payload_;
    local_430._M_len = (size_t)*puVar1;
    local_430._M_str = (char *)((long)puVar1 + ~local_430._M_len);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (local_310,&local_3a0,&local_430);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"input",&local_44e);
    pDVar2 = MethodDescriptor::input_type(this_00);
    QualifiedClassName_abi_cxx11_
              (&local_380,(cpp *)pDVar2,(Descriptor *)local_448->split_map,local_448);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_310 + 1,&local_360,&local_380);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"output",&local_44f);
    pDVar2 = MethodDescriptor::output_type(this_00);
    QualifiedClassName_abi_cxx11_
              (&local_3c0,(cpp *)pDVar2,(Descriptor *)local_448->split_map,local_448);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_310 + 2,&local_400,&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"index",&local_450);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_340,local_44c);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_3e0,(lts_20250127 *)&local_340,a);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_310 + 3,&local_420,&local_3e0);
    io::Printer::Emit(local_438,local_310,4,0xcd,
                      "\n          case $index$:\n            this->$name$(controller, $pb$::DownCastMessage<$input$>(request),\n                         $pb$::DownCastMessage<$output$>(response), done);\n            break;\n        "
                     );
    lVar3 = 0x228;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_310[0].key_._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0xb8;
    } while (lVar3 != -0xb8);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateCallMethodCases(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
            {"index", absl::StrCat(i)},
        },
        R"cc(
          case $index$:
            this->$name$(controller, $pb$::DownCastMessage<$input$>(request),
                         $pb$::DownCastMessage<$output$>(response), done);
            break;
        )cc");
  }
}